

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionClrStr.cpp
# Opt level: O0

void __thiscall Hpipe::InstructionClrStr::get_code_repr(InstructionClrStr *this,ostream *os)

{
  ostream *poVar1;
  ulong uVar2;
  ostream *os_local;
  InstructionClrStr *this_local;
  
  poVar1 = std::operator<<(os,"CLR_STR ");
  uVar2 = std::__cxx11::string::size();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(string *)&this->var);
  return;
}

Assistant:

void InstructionClrStr::get_code_repr( std::ostream &os ) {
    os << "CLR_STR " << var.size() << " " << var;
}